

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
wasm::TopologicalSort::minSort<std::less<unsigned_int>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__)

{
  TopologicalOrdersImpl<std::less<unsigned_int>_> local_80;
  
  TopologicalOrdersImpl<std::less<unsigned_int>_>::TopologicalOrdersImpl(&local_80);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,&local_80.buf);
  TopologicalOrdersImpl<std::less<unsigned_int>_>::~TopologicalOrdersImpl(&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> minSort(const Graph& graph, Cmp cmp) {
  return *TopologicalOrdersImpl<Cmp>(graph, cmp);
}